

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

node_type * __thiscall
st_tree::detail::
node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
::parent(node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
         *this)

{
  parent_exception *this_00;
  allocator<char> local_31;
  string local_30;
  
  if (this->_parent != (node_type *)0x0) {
    return this->_parent;
  }
  this_00 = (parent_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"parent(): node has no parent",&local_31);
  parent_exception::parent_exception(this_00,&local_30);
  __cxa_throw(this_00,&parent_exception::typeinfo,exception::~exception);
}

Assistant:

bool is_root() const { return NULL == _parent; }